

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor-transfer-function.h
# Opt level: O3

void __thiscall
wasm::analysis::
VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
::collectResults(VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 *this,BasicBlock *bb,Element *inputState)

{
  pointer ppEVar1;
  
  this->collectingResults = true;
  this->currState = inputState;
  ppEVar1 = (bb->insts).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 !=
      (bb->insts).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      Visitor<wasm::analysis::ReachingDefinitionsTransferFunction,_void>::visit
                ((Visitor<wasm::analysis::ReachingDefinitionsTransferFunction,_void> *)this,*ppEVar1
                );
      ppEVar1 = ppEVar1 + 1;
    } while (ppEVar1 !=
             (bb->insts).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  this->currState = (Element *)0x0;
  this->collectingResults = false;
  return;
}

Assistant:

void collectResults(const BasicBlock& bb, typename L::Element& inputState) {
    collectingResults = true;
    currState = &inputState;
    if constexpr (Direction == AnalysisDirection::Backward) {
      for (auto it = bb.rbegin(); it != bb.rend(); ++it) {
        static_cast<SubType*>(this)->visit(*it);
      }
    } else {
      for (auto it = bb.begin(); it != bb.end(); ++it) {
        static_cast<SubType*>(this)->visit(*it);
      }
    }
    currState = nullptr;
    collectingResults = false;
  }